

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

char * libssh2_hostkey_hash(LIBSSH2_SESSION *session,int hash_type)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  
  if (hash_type == 1) {
    lVar2 = 0xbc;
    lVar3 = 0xcc;
  }
  else {
    if (hash_type != 2) {
      return (char *)0x0;
    }
    lVar2 = 0xd0;
    lVar3 = 0xe4;
  }
  pcVar1 = (char *)0x0;
  if (*(int *)((long)&session->abstract + lVar3) != 0) {
    pcVar1 = (char *)((long)&session->abstract + lVar2);
  }
  return pcVar1;
}

Assistant:

LIBSSH2_API const char *
libssh2_hostkey_hash(LIBSSH2_SESSION * session, int hash_type)
{
    switch (hash_type) {
#if LIBSSH2_MD5
    case LIBSSH2_HOSTKEY_HASH_MD5:
        return (session->server_hostkey_md5_valid)
          ? (char *) session->server_hostkey_md5
          : NULL;
        break;
#endif /* LIBSSH2_MD5 */
    case LIBSSH2_HOSTKEY_HASH_SHA1:
        return (session->server_hostkey_sha1_valid)
          ? (char *) session->server_hostkey_sha1
          : NULL;
        break;
    default:
        return NULL;
    }
}